

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O1

int __thiscall llbuild::ninja::Lexer::getNextChar(Lexer *this)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  
  pcVar3 = this->bufferPos;
  pcVar5 = (this->buffer).Data + (this->buffer).Length;
  if (pcVar3 == pcVar5) {
    return -1;
  }
  pcVar1 = pcVar3 + 1;
  this->bufferPos = pcVar1;
  cVar2 = *pcVar3;
  if ((((cVar2 == '\r') || (cVar4 = cVar2, cVar2 == '\n')) && (cVar4 = '\n', pcVar1 != pcVar5)) &&
     (*pcVar1 == (char)('\x17' - cVar2))) {
    this->bufferPos = pcVar3 + 2;
  }
  if (cVar4 != '\n') {
    this->columnNumber = this->columnNumber + 1;
    return (int)cVar4;
  }
  this->lineNumber = this->lineNumber + 1;
  this->columnNumber = 0;
  return (int)cVar4;
}

Assistant:

iterator end() const { return Data + Length; }